

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O0

vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> * __thiscall
BaseFixture::randomVectors(BaseFixture *this,int n,FP3 *minValue,FP3 *maxValue)

{
  FP3 a;
  FP3 b;
  long lVar1;
  reference pvVar2;
  int in_EDX;
  undefined8 in_RSI;
  vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> *in_RDI;
  double *in_R8;
  int i;
  vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> *result;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> *in_stack_ffffffffffffff30;
  vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> *this_00;
  undefined1 *puVar3;
  double local_58;
  double local_50;
  double local_48;
  int local_40;
  undefined1 local_2a;
  undefined1 local_29;
  double *local_28;
  int local_14;
  
  local_29 = 0;
  lVar1 = (long)in_EDX;
  puVar3 = &local_2a;
  this_00 = in_RDI;
  local_28 = in_R8;
  local_14 = in_EDX;
  std::allocator<pica::Vector3<double>_>::allocator((allocator<pica::Vector3<double>_> *)0x23c69f);
  std::vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<pica::Vector3<double>_>::~allocator((allocator<pica::Vector3<double>_> *)0x23c6c2);
  for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
    a.y = (double)in_RSI;
    a.x = (double)in_RDI;
    a.z = (double)this_00;
    b.y = (double)puVar3;
    b.x = (double)lVar1;
    b.z = *local_28;
    urandFP3((BaseFixture *)local_28[2],a,b);
    pvVar2 = std::vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>::operator[]
                       (this_00,(long)local_40);
    pvVar2->x = local_58;
    pvVar2->y = local_50;
    pvVar2->z = local_48;
  }
  return in_RDI;
}

Assistant:

std::vector<FP3> BaseFixture::randomVectors(int n, FP3 & minValue, FP3 & maxValue) {
    std::vector<FP3> result(n);
    for (int i = 0; i < n; ++i)
        result[i] = urandFP3(minValue, maxValue);
    return result;
}